

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O2

REF_STATUS ref_list_delete(REF_LIST ref_list,REF_INT item)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < ref_list->n; lVar3 = lVar3 + 1) {
    iVar1 = ref_list->value[lVar3];
    if (iVar1 != item) {
      ref_list->value[iVar2] = iVar1;
      iVar2 = iVar2 + 1;
    }
  }
  if (iVar2 == ref_list->n) {
    return 5;
  }
  ref_list->n = iVar2;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_list_delete(REF_LIST ref_list, REF_INT item) {
  REF_INT to, from;

  to = 0;
  for (from = 0; from < ref_list_n(ref_list); from++) {
    if (item != ref_list->value[from]) {
      ref_list->value[to] = ref_list->value[from];
      to++;
    }
  }

  if (to == ref_list_n(ref_list)) return REF_NOT_FOUND;

  ref_list_n(ref_list) = to;

  return REF_SUCCESS;
}